

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O3

void __thiscall RenderFuncTable::RenderFuncTable(RenderFuncTable *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&(this->colorTable)._M_elems[0].type_ + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  lVar1 = 0x40;
  do {
    *(undefined4 *)((long)&(this->colorTable)._M_elems[0].type_ + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  (this->colorTable)._M_elems[0].type_ = Color;
  (this->colorTable)._M_elems[0].field_1.color_ = color_Source;
  (this->colorTable)._M_elems[1].type_ = Color;
  (this->colorTable)._M_elems[1].field_1.color_ = color_SourceOver;
  (this->colorTable)._M_elems[2].type_ = Color;
  (this->colorTable)._M_elems[2].field_1.color_ = color_DestinationIn;
  (this->colorTable)._M_elems[3].type_ = Color;
  (this->colorTable)._M_elems[3].field_1.color_ = color_DestinationOut;
  (this->srcTable)._M_elems[0].type_ = Src;
  (this->srcTable)._M_elems[0].field_1.color_ = src_Source;
  (this->srcTable)._M_elems[1].type_ = Src;
  (this->srcTable)._M_elems[1].field_1.color_ = src_SourceOver;
  (this->srcTable)._M_elems[2].type_ = Src;
  (this->srcTable)._M_elems[2].field_1.color_ = src_DestinationIn;
  (this->srcTable)._M_elems[3].type_ = Src;
  (this->srcTable)._M_elems[3].field_1.color_ = src_DestinationOut;
  sse(this);
  return;
}

Assistant:

RenderFuncTable::RenderFuncTable()
{
    updateColor(BlendMode::Src, color_Source);
    updateColor(BlendMode::SrcOver, color_SourceOver);
    updateColor(BlendMode::DestIn, color_DestinationIn);
    updateColor(BlendMode::DestOut, color_DestinationOut);

    updateSrc(BlendMode::Src, src_Source);
    updateSrc(BlendMode::SrcOver, src_SourceOver);
    updateSrc(BlendMode::DestIn, src_DestinationIn);
    updateSrc(BlendMode::DestOut, src_DestinationOut);

#if defined(__ARM_NEON__)
    neon();
#endif
#if defined(__SSE2__)
    sse();
#endif
}